

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

const_iterator __thiscall
ghc::filesystem::path::iterator::increment(iterator *this,const_iterator *pos)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar1 = pos->_M_current;
  pcVar2 = (this->_last)._M_current;
  if (pcVar2 == pcVar1) {
    return (const_iterator)pcVar1;
  }
  pcVar3 = (this->_first)._M_current;
  pcVar6 = pcVar1 + 1;
  if (*pcVar1 == '/') {
    if (pcVar6 == pcVar2) {
      return (const_iterator)pcVar6;
    }
    if (*pcVar6 != '/') {
      return (const_iterator)pcVar6;
    }
    if ((pcVar3 != pcVar1) || ((pcVar5 = pcVar1 + 2, pcVar5 != pcVar2 && (*pcVar5 == '/')))) {
      while( true ) {
        if (pcVar6 == pcVar2) {
          return (const_iterator)pcVar2;
        }
        if (*pcVar6 != '/') break;
        pcVar6 = pcVar6 + 1;
      }
      return (const_iterator)pcVar6;
    }
  }
  else {
    pcVar5 = pcVar6;
    if ((pcVar6 != pcVar2 && pcVar3 == pcVar1) && (*pcVar6 == ':')) {
      return (const_iterator)(pcVar1 + 2);
    }
  }
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (pcVar5);
  return (const_iterator)_Var4._M_current;
}

Assistant:

GHC_INLINE path::impl_string_type::const_iterator path::iterator::increment(const path::impl_string_type::const_iterator& pos) const
{
    path::impl_string_type::const_iterator i = pos;
    bool fromStart = i == _first;
    if (i != _last) {
        // we can only sit on a slash if it is a network name or a root
        if (*i++ == '/') {
            if (i != _last && *i == '/') {
                if (fromStart && !(i + 1 != _last && *(i + 1) == '/')) {
                    // leadind double slashes detected, treat this and the
                    // following until a slash as one unit
                    i = std::find(++i, _last, '/');
                }
                else {
                    // skip redundant slashes
                    while (i != _last && *i == '/') {
                        ++i;
                    }
                }
            }
        }
        else {
            if (fromStart && i != _last && *i == ':') {
                ++i;
            }
            else {
                i = std::find(i, _last, '/');
            }
        }
    }
    return i;
}